

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_ObjAwaken(FParser *this)

{
  AActor *activator;
  AActor *local_18;
  AActor *mo;
  FParser *this_local;
  
  if (this->t_argc == 0) {
    local_18 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger);
  }
  else {
    local_18 = actorvalue(this->t_argv);
  }
  if (local_18 != (AActor *)0x0) {
    activator = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger);
    AActor::CallActivate(local_18,activator);
  }
  return;
}

Assistant:

void FParser::SF_ObjAwaken(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
   	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	if(mo)
	{
		mo->CallActivate(Script->trigger);
	}
}